

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::CSVMultiFileInfo::InitializeGlobalState
           (ClientContext *context,MultiFileBindData *bind_data,MultiFileGlobalState *global_state)

{
  int iVar1;
  ReadCSVData *data;
  CSVRejectsTable *this;
  MultiFileList *pMVar2;
  undefined4 extraout_var;
  element_type *this_00;
  undefined8 local_38;
  
  data = (ReadCSVData *)
         unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
         ::operator->((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
                       *)&global_state->multi_file_reader_state);
  if ((data->super_BaseCSVData).options.store_rejects.value == true) {
    CSVRejectsTable::GetOrCreate
              ((CSVRejectsTable *)&stack0xffffffffffffffc0,(ClientContext *)bind_data,
               &(data->super_BaseCSVData).options.rejects_scan_name.value,
               &(data->super_BaseCSVData).options.rejects_table_name.value);
    this = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->
                     ((shared_ptr<duckdb::CSVRejectsTable,_true> *)&stack0xffffffffffffffc0);
    CSVRejectsTable::InitializeTable(this,(ClientContext *)bind_data,data);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
  }
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)&global_state->lock);
  iVar1 = (*pMVar2->_vptr_MultiFileList[6])(pMVar2);
  this_00 = (element_type *)operator_new(0xb8);
  CSVGlobalState::CSVGlobalState
            ((CSVGlobalState *)this_00,(ClientContext *)bind_data,&(data->super_BaseCSVData).options
             ,CONCAT44(extraout_var,iVar1),(MultiFileBindData *)global_state);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> CSVMultiFileInfo::InitializeGlobalState(ClientContext &context,
                                                                             MultiFileBindData &bind_data,
                                                                             MultiFileGlobalState &global_state) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();

	// Create the temporary rejects table
	if (csv_data.options.store_rejects.GetValue()) {
		CSVRejectsTable::GetOrCreate(context, csv_data.options.rejects_scan_name.GetValue(),
		                             csv_data.options.rejects_table_name.GetValue())
		    ->InitializeTable(context, csv_data);
	}
	return make_uniq<CSVGlobalState>(context, csv_data.options, bind_data.file_list->GetTotalFileCount(), bind_data);
}